

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

int queue_resize_buffers(mixed_buffer ***buffers,uint32_t *count,uint32_t new)

{
  mixed_buffer **ppmVar1;
  uint32_t new_local;
  uint32_t *count_local;
  mixed_buffer ***buffers_local;
  
  if (new != *count) {
    if (new == 0) {
      (*mixed_free)(*buffers);
      *buffers = (mixed_buffer **)0x0;
    }
    else {
      ppmVar1 = (mixed_buffer **)crealloc(*buffers,(ulong)*count,(ulong)new,8);
      *buffers = ppmVar1;
      if (*buffers == (mixed_buffer **)0x0) {
        mixed_err(1);
        return 0;
      }
    }
    *count = new;
  }
  return 1;
}

Assistant:

int queue_resize_buffers(struct mixed_buffer ***buffers, uint32_t *count, uint32_t new){
  if(new == *count) return 1;
  if(new == 0){
    mixed_free(*buffers);
    *buffers = 0;
  }else{
    *buffers = crealloc(*buffers, *count, new, sizeof(struct mixed_buffer *));
    if(!*buffers){
      mixed_err(MIXED_OUT_OF_MEMORY);
      return 0;
    }
  }
  *count = new;
  return 1;
}